

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_fmt.c
# Opt level: O0

void beltBin2StrAdd(u32 mod,u16 *str,size_t count,octet *bin,size_t b)

{
  word wVar1;
  word *in_RCX;
  word *pwVar2;
  word *in_RDX;
  word *in_RSI;
  uint in_EDI;
  size_t in_R8;
  u16 *uu;
  size_t m;
  word *a;
  u32 t;
  void *in_stack_ffffffffffffffb8;
  u16 *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  
  if (in_EDI == 0x10000) {
    u16From(in_stack_ffffffffffffffc0,in_RCX,0x149ca6);
    while (pwVar2 = (word *)((long)in_RDX + -1), in_RDX != (word *)0x0) {
      *(ushort *)((long)in_RSI + (long)pwVar2 * 2) =
           *(ushort *)((long)in_RSI + (long)pwVar2 * 2) +
           *(short *)((long)in_RCX + (long)pwVar2 * 2);
      in_RDX = pwVar2;
    }
  }
  else {
    u64From((u64 *)(in_R8 * 8 + 7 >> 3),in_stack_ffffffffffffffb8,0x149d21);
    while (pwVar2 = (word *)((long)in_RDX + -1), in_RDX != (word *)0x0) {
      wVar1 = zzModW(in_RCX,in_R8,CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      in_stack_ffffffffffffffd4 = ((uint)(ushort)*in_RSI + (int)wVar1) % in_EDI;
      *(ushort *)in_RSI = (ushort)in_stack_ffffffffffffffd4;
      in_RSI = (word *)((long)in_RSI + 2);
      zzDivW(in_RSI,pwVar2,(size_t)in_RCX,in_R8);
      in_RDX = pwVar2;
    }
  }
  return;
}

Assistant:

static void beltBin2StrAdd(u32 mod, u16 str[], size_t count, 
	octet bin[], size_t b)
{
	register u32 t;
	word* a;
	size_t m;
	// особый случай: mod может не уложиться в word
	if (mod == 65536)
	{
		u16* uu = (u16*)bin;
		u16From(uu, bin, 8 * b);
		while (count--)
			str[count] += uu[count];
		return;
	}
	// настроить память
	m = W_OF_O(8 * b);
	a = (word*)bin;
	wwFrom(a, bin, 8 * b);
	// конвертировать и сложить
	ASSERT(2 <= mod && mod < 65536);
	while (count--)
	{
		t = (u32)zzModW(a, m, mod);
		t += str[0], t %= mod;
		str[0] = (u16)t, ++str;
		zzDivW(a, a, m, mod);
	}
	t = 0;
}